

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<float_const&,float_const&,int_const&,pstd::vector<pbrt::MLTSampler::PrimarySample,pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>>const&,long_const&,bool_const&,long_const&,int_const&,int_const&>
               (string *s,char *fmt,float *v,float *args,int *args_1,
               vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
               *args_2,long *args_3,bool *args_4,long *args_5,int *args_6,int *args_7)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  char *in_RCX;
  string *in_RDX;
  bool *unaff_RBX;
  string *in_RDI;
  float *in_R8;
  int *in_R9;
  long *unaff_R14;
  int *unaff_retaddr;
  int *in_stack_00000008;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  char *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  undefined6 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd76;
  undefined1 in_stack_fffffffffffffd77;
  char **in_stack_fffffffffffffd78;
  char **in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  string local_268 [32];
  undefined8 local_248;
  string local_240 [32];
  stringstream local_220 [8];
  char *in_stack_fffffffffffffde8;
  undefined1 local_210 [4];
  int in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  LogLevel in_stack_fffffffffffffe04;
  float in_stack_fffffffffffffe4c;
  string local_98 [53];
  byte local_63;
  byte local_62;
  byte local_61;
  string local_60 [16];
  long *in_stack_ffffffffffffffb0;
  vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
  *in_stack_ffffffffffffffb8;
  
  copyToFormatString(in_stack_fffffffffffffd78,
                     (string *)
                     CONCAT17(in_stack_fffffffffffffd77,
                              CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)));
  lVar2 = std::__cxx11::string::find((char)local_60,0x2a);
  local_61 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_60,0x73);
  local_62 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_60,100);
  local_63 = lVar2 != -1;
  if ((local_61 & 1) != 0) {
    LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
             in_stack_fffffffffffffde8);
  }
  bVar1 = std::operator==(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48), bVar1)) {
    FloatToString_abi_cxx11_(in_stack_fffffffffffffe4c);
    std::__cxx11::string::operator+=(in_RDI,local_98);
    std::__cxx11::string::~string(local_98);
  }
  else {
    if ((local_63 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffde8);
    }
    if ((local_62 & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                 in_stack_fffffffffffffde8);
      }
      std::__cxx11::string::c_str();
      formatOne<float_const&>(in_stack_fffffffffffffd88,(float *)in_stack_fffffffffffffd80);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd78);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_220);
      std::ostream::operator<<(local_210,*(float *)in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      local_248 = std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      std::__cxx11::string::operator+=(in_RDI,local_240);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::stringstream::~stringstream(local_220);
    }
  }
  stringPrintfRecursive<float_const&,int_const&,pstd::vector<pbrt::MLTSampler::PrimarySample,pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>>const&,long_const&,bool_const&,long_const&,int_const&,int_const&>
            (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,unaff_RBX
             ,unaff_R14,unaff_retaddr,in_stack_00000008);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}